

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O1

void __thiscall Diligent::VAOCache::VAOHashKey::VAOHashKey(VAOHashKey *this,VAOAttribs *Attribs)

{
  LayoutElement *pLVar1;
  BufferGLImpl *this_00;
  Int32 IVar2;
  int iVar3;
  long lVar4;
  GraphicsPipelineDesc *pGVar5;
  uint uVar6;
  char (*in_RCX) [37];
  Uint64 *RestArgs;
  VertexStreamInfo<Diligent::BufferGLImpl> *pVVar7;
  char (*in_R8) [36];
  ulong uVar8;
  Uint32 *pUVar9;
  ulong uVar10;
  undefined7 in_stack_ffffffffffffff68;
  size_t Seed;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  Uint32 BufferSlot;
  VAOAttribs *local_68;
  int local_5c;
  Uint32 *local_58;
  size_t *local_50;
  GraphicsPipelineDesc *local_48;
  char *local_40;
  char *local_38;
  
  IVar2 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)Attribs->PSO);
  this->PsoUId = IVar2;
  local_68 = Attribs;
  if (Attribs->pIndexBuffer == (BufferGLImpl *)0x0) {
    IVar2 = 0;
  }
  else {
    IVar2 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                           *)Attribs->pIndexBuffer);
  }
  this->IndexBufferUId = IVar2;
  this->UsedSlotsMask = 0;
  local_50 = &this->Hash;
  this->Hash = 0;
  lVar4 = 0x10;
  do {
    *(undefined4 *)((long)&((VAOHashKey *)(this->Streams + -1))->PsoUId + lVar4) = 0xffffffff;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x210);
  pGVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&local_68->PSO->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  pLVar1 = (pGVar5->InputLayout).LayoutElements;
  Seed = 0;
  HashCombine<int,int>(&Seed,&this->PsoUId,&this->IndexBufferUId);
  this->Hash = Seed;
  if ((pGVar5->InputLayout).NumElements != 0) {
    local_58 = &local_68->NumVertexStreams;
    pUVar9 = &pLVar1->BufferSlot;
    uVar8 = 0;
    local_48 = pGVar5;
    do {
      BufferSlot = *pUVar9;
      if (0x1f < BufferSlot) {
        FormatString<char[26],char[30]>
                  ((string *)&Seed,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BufferSlot < MAX_BUFFER_SLOTS",(char (*) [30])in_RCX);
        DebugAssertionFailed
                  ((Char *)Seed,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xbd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)Seed != &local_80) {
          operator_delete((void *)Seed,local_80._M_allocated_capacity + 1);
        }
      }
      if (*local_58 <= BufferSlot) {
        local_5c = BufferSlot + 1;
        local_38 = "s";
        if (BufferSlot == 0) {
          local_38 = "";
        }
        local_40 = "are";
        if (*local_58 == 1) {
          local_40 = "is";
        }
        in_R8 = (char (*) [36])&local_38;
        FormatString<char[32],unsigned_int,char[8],char_const*,char[12],unsigned_int,char,char_const*,char[8]>
                  ((string *)&Seed,(Diligent *)"Input layout requires at least ",
                   (char (*) [32])&local_5c,(uint *)0x841434,(char (*) [8])in_R8,(char **)0x917dc5,
                   (char (*) [12])local_58,(uint *)&stack0xffffffffffffff6f,(char *)&local_40,
                   (char **)0x829a04,(char (*) [8])CONCAT17(0x20,in_stack_ffffffffffffff68));
        DebugAssertionFailed
                  ((Char *)Seed,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xc0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)Seed != &local_80) {
          operator_delete((void *)Seed,local_80._M_allocated_capacity + 1);
        }
      }
      pVVar7 = local_68->VertexStreams;
      uVar10 = (ulong)BufferSlot;
      if (pVVar7[uVar10].pBuffer.m_pObject == (BufferGLImpl *)0x0) {
        FormatString<char[29],unsigned_int,char[36]>
                  ((string *)&Seed,(Diligent *)"VAO requires buffer at slot ",
                   (char (*) [29])&BufferSlot,(uint *)", but none is bound in the context.",in_R8);
        DebugAssertionFailed
                  ((Char *)Seed,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xc3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)Seed != &local_80) {
          operator_delete((void *)Seed,local_80._M_allocated_capacity + 1);
        }
      }
      pVVar7 = pVVar7 + uVar10;
      this_00 = (pVVar7->pBuffer).m_pObject;
      if (this_00 == (BufferGLImpl *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                               *)this_00);
      }
      uVar10 = (ulong)BufferSlot;
      uVar6 = this->UsedSlotsMask;
      in_RCX = (char (*) [37])(ulong)uVar6;
      if ((uVar6 >> (BufferSlot & 0x1f) & 1) == 0) {
        RestArgs = &this->Streams[uVar10].Offset;
        this->Streams[uVar10].BufferUId = iVar3;
        *RestArgs = pVVar7->Offset;
        uVar6 = uVar6 | 1 << ((byte)BufferSlot & 0x1f);
        in_RCX = (char (*) [37])(ulong)uVar6;
        this->UsedSlotsMask = uVar6;
        HashCombine<int,unsigned_long>(local_50,&this->Streams[uVar10].BufferUId,RestArgs);
      }
      else {
        if (this->Streams[uVar10].BufferUId != iVar3) {
          FormatString<char[26],char[30]>
                    ((string *)&Seed,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"DstStream.BufferUId == BuffId",(char (*) [30])in_RCX);
          in_RCX = (char (*) [37])0xd3;
          DebugAssertionFailed
                    ((Char *)Seed,"VAOHashKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                     ,0xd3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)Seed != &local_80) {
            operator_delete((void *)Seed,local_80._M_allocated_capacity + 1);
          }
        }
        if (this->Streams[uVar10].Offset != pVVar7->Offset) {
          FormatString<char[26],char[37]>
                    ((string *)&Seed,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"DstStream.Offset == SrcStream.Offset",in_RCX);
          in_RCX = (char (*) [37])0xd4;
          DebugAssertionFailed
                    ((Char *)Seed,"VAOHashKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                     ,0xd4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)Seed != &local_80) {
            operator_delete((void *)Seed,local_80._M_allocated_capacity + 1);
          }
        }
      }
      uVar8 = uVar8 + 1;
      pUVar9 = pUVar9 + 10;
    } while (uVar8 < (local_48->InputLayout).NumElements);
  }
  uVar6 = this->UsedSlotsMask * 0x1001;
  uVar6 = (uVar6 >> 0x16 ^ uVar6) * 0x11;
  uVar6 = (uVar6 >> 9 ^ uVar6) * 0x401;
  uVar8 = this->Hash;
  this->Hash = (uVar8 >> 2) + uVar8 * 0x40 + 0x9e3779b9 + (ulong)((uVar6 >> 2 ^ uVar6) * 0x81081) ^
               uVar8;
  return;
}

Assistant:

VAOCache::VAOHashKey::VAOHashKey(const VAOAttribs& Attribs) :
    // clang-format off
    PsoUId         {Attribs.PSO.GetUniqueID()},
    IndexBufferUId {Attribs.pIndexBuffer ? Attribs.pIndexBuffer->GetUniqueID() : 0}
// clang-format on
{
#ifdef DILIGENT_DEBUG
    for (Uint32 i = 0; i < _countof(Streams); ++i)
        Streams[i].BufferUId = -1;
#endif

    const auto& InputLayout    = Attribs.PSO.GetGraphicsPipelineDesc().InputLayout;
    const auto* LayoutElements = InputLayout.LayoutElements;

    Hash = ComputeHash(PsoUId, IndexBufferUId);
    for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
    {
        const auto& LayoutElem = LayoutElements[i];
        const auto  BufferSlot = LayoutElem.BufferSlot;
        VERIFY_EXPR(BufferSlot < MAX_BUFFER_SLOTS);
        DEV_CHECK_ERR(BufferSlot < Attribs.NumVertexStreams, "Input layout requires at least ", BufferSlot + 1,
                      " buffer", (BufferSlot > 0 ? "s" : ""), ", but only ", Attribs.NumVertexStreams, ' ',
                      (Attribs.NumVertexStreams == 1 ? "is" : "are"), " bound.");

        const auto& SrcStream = Attribs.VertexStreams[BufferSlot];
        DEV_CHECK_ERR(SrcStream.pBuffer, "VAO requires buffer at slot ", BufferSlot, ", but none is bound in the context.");

        const auto BuffId  = SrcStream.pBuffer ? SrcStream.pBuffer->GetUniqueID() : 0;
        const auto SlotBit = 1u << BufferSlot;
        if ((UsedSlotsMask & SlotBit) == 0)
        {
            auto& DstStream     = Streams[BufferSlot];
            DstStream.BufferUId = BuffId;
            DstStream.Offset    = SrcStream.Offset;
            UsedSlotsMask |= SlotBit;
            HashCombine(Hash, DstStream.BufferUId, DstStream.Offset);
        }
        else
        {
            const auto& DstStream = Streams[BufferSlot];
            // The slot has already been initialized
            VERIFY_EXPR(DstStream.BufferUId == BuffId);
            VERIFY_EXPR(DstStream.Offset == SrcStream.Offset);
        }
    }
    HashCombine(Hash, UsedSlotsMask);
}